

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

void __thiscall QDockAreaLayoutInfo::deleteAllLayoutItems(QDockAreaLayoutInfo *this)

{
  long lVar1;
  qsizetype qVar2;
  reference pQVar3;
  long in_RDI;
  QDockAreaLayoutItem *item;
  int i;
  qsizetype in_stack_ffffffffffffffc8;
  QLayoutItem *in_stack_ffffffffffffffd0;
  undefined4 in_stack_fffffffffffffff0;
  int iVar4;
  
  iVar4 = 0;
  while( true ) {
    lVar1 = (long)iVar4;
    qVar2 = QList<QDockAreaLayoutItem>::size((QList<QDockAreaLayoutItem> *)(in_RDI + 0x40));
    if (qVar2 <= lVar1) break;
    pQVar3 = QList<QDockAreaLayoutItem>::operator[]
                       ((QList<QDockAreaLayoutItem> *)in_stack_ffffffffffffffd0,
                        in_stack_ffffffffffffffc8);
    if (pQVar3->subinfo == (QDockAreaLayoutInfo *)0x0) {
      in_stack_ffffffffffffffd0 = pQVar3->widgetItem;
      if (in_stack_ffffffffffffffd0 != (QLayoutItem *)0x0) {
        (*in_stack_ffffffffffffffd0->_vptr_QLayoutItem[1])();
      }
      pQVar3->widgetItem = (QLayoutItem *)0x0;
    }
    else {
      deleteAllLayoutItems((QDockAreaLayoutInfo *)CONCAT44(iVar4,in_stack_fffffffffffffff0));
    }
    iVar4 = iVar4 + 1;
  }
  return;
}

Assistant:

void QDockAreaLayoutInfo::deleteAllLayoutItems()
{
    for (int i = 0; i < item_list.size(); ++i) {
        QDockAreaLayoutItem &item= item_list[i];
        if (item.subinfo) {
            item.subinfo->deleteAllLayoutItems();
        } else {
            delete item.widgetItem;
            item.widgetItem = nullptr;
        }
    }
}